

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

void __thiscall
Assimp::FindInvalidDataProcess::Execute(FindInvalidDataProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiMesh *this_00;
  int iVar2;
  Logger *pLVar3;
  reference pvVar4;
  DeadlyImportError *this_01;
  allocator local_81;
  string local_80;
  uint local_5c;
  int local_58;
  uint a_1;
  int result;
  uint a;
  uint real;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshMapping;
  bool out;
  aiScene *pScene_local;
  FindInvalidDataProcess *this_local;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindInvalidDataProcess begin");
  meshMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  uVar1 = pScene->mNumMeshes;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)uVar1,&local_39)
  ;
  std::allocator<unsigned_int>::~allocator(&local_39);
  result = 0;
  for (a_1 = 0; a_1 < pScene->mNumMeshes; a_1 = a_1 + 1) {
    local_58 = ProcessMesh(this,pScene->mMeshes[a_1]);
    iVar2 = result;
    if ((local_58 == 0) ||
       (meshMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1, local_58 != 2)) {
      pScene->mMeshes[(uint)result] = pScene->mMeshes[a_1];
      result = result + 1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)a_1
                         );
      *pvVar4 = iVar2;
    }
    else {
      this_00 = pScene->mMeshes[a_1];
      if (this_00 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_00);
        operator_delete(this_00);
      }
      pScene->mMeshes[a_1] = (aiMesh *)0x0;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)a_1
                         );
      *pvVar4 = 0xffffffff;
    }
  }
  for (local_5c = 0; local_5c < pScene->mNumAnimations; local_5c = local_5c + 1) {
    ProcessAnimation(this,pScene->mAnimations[local_5c]);
  }
  if ((meshMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"FindInvalidDataProcess finished. Everything seems to be OK.");
  }
  else {
    if (result != pScene->mNumMeshes) {
      if (result == 0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80,"No meshes remaining",&local_81);
        DeadlyImportError::DeadlyImportError(this_01,&local_80);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      UpdateMeshReferences
                (pScene->mRootNode,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      pScene->mNumMeshes = result;
    }
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"FindInvalidDataProcess finished. Found issues ...");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void FindInvalidDataProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindInvalidDataProcess begin");

    bool out = false;
    std::vector<unsigned int> meshMapping(pScene->mNumMeshes);
    unsigned int real = 0;

    // Process meshes
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {

        int result;
        if ((result = ProcessMesh( pScene->mMeshes[a])))    {
            out = true;

            if (2 == result)    {
                // remove this mesh
                delete pScene->mMeshes[a];
                AI_DEBUG_INVALIDATE_PTR(pScene->mMeshes[a]);

                meshMapping[a] = UINT_MAX;
                continue;
            }
        }
        pScene->mMeshes[real] = pScene->mMeshes[a];
        meshMapping[a] = real++;
    }

    // Process animations
    for (unsigned int a = 0; a < pScene->mNumAnimations;++a) {
        ProcessAnimation( pScene->mAnimations[a]);
    }


    if (out)    {
        if ( real != pScene->mNumMeshes)    {
            if (!real) {
                throw DeadlyImportError("No meshes remaining");
            }

            // we need to remove some meshes.
            // therefore we'll also need to remove all references
            // to them from the scenegraph
            UpdateMeshReferences(pScene->mRootNode,meshMapping);
            pScene->mNumMeshes = real;
        }

        ASSIMP_LOG_INFO("FindInvalidDataProcess finished. Found issues ...");
    } else {
        ASSIMP_LOG_DEBUG("FindInvalidDataProcess finished. Everything seems to be OK.");
    }
}